

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chset.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
test_posix(compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,char_type ch,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  not_posix_pred pred_00;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  end;
  uint uVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_RDX;
  char in_SIL;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RDI;
  not_posix_pred pred;
  bool local_49;
  undefined7 in_stack_ffffffffffffffd9;
  
  uVar1 = cpp_regex_traits<char>::isctype
                    ((cpp_regex_traits<char> *)in_RDX._M_current,(int)in_SIL,
                     (uint)*(ushort *)
                            ((long)&in_RDI[1].
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 2));
  local_49 = true;
  if ((uVar1 & 1) == 0) {
    cVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(in_RDI);
    cVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(in_RDI);
    end._M_current._1_7_ = in_stack_ffffffffffffffd9;
    end._M_current._0_1_ = in_SIL;
    pred_00.traits_ptr_ =
         (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)cVar2._M_current;
    pred_00._0_8_ = cVar3._M_current;
    local_49 = any<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::not_posix_pred>
                         (in_RDX,end,pred_00);
  }
  return local_49;
}

Assistant:

bool test_posix(char_type ch, Traits const &tr) const
    {
        not_posix_pred const pred = {ch, &tr};
        return tr.isctype(ch, this->posix_yes_)
            || any(this->posix_no_.begin(), this->posix_no_.end(), pred);
    }